

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmMakefile *this_00;
  size_t sVar1;
  bool bVar2;
  reference ppcVar3;
  cmLinkImplementation *this_01;
  reference __x;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_02;
  reference this_03;
  string *sourceName;
  reference ppcVar4;
  reference __x_00;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar5;
  cmLinkItem *litem;
  iterator __end1_1;
  iterator __begin1_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *__range1_1;
  cmListFileBacktrace local_2f8;
  cmLinkItem local_2e8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  cmListFileBacktrace local_298;
  cmLinkItem local_288;
  undefined1 local_248 [8];
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *tutils;
  cmSourceFile *o_1;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  cmSourceFile *o;
  cmLinkItem *obj;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3_1;
  cmLinkImplItem *lib;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range3;
  cmLinkImplementation *impl;
  cmListFileBacktrace local_158;
  cmLinkItem local_148;
  _Base_ptr local_108;
  undefined1 local_100;
  cmListFileBacktrace local_f8;
  cmLinkItem local_e0;
  reference local_a0;
  string *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  cmGeneratorTarget *depender;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar3;
  bVar2 = cmGeneratorTarget::IsInBuildSystem
                    ((cmGeneratorTarget *)emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&configs);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_70,
               *(cmMakefile **)(emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 8),
               IncludeEmptyConfig);
    local_58 = &local_70;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&local_70);
    it = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_70);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&it), bVar2) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      sVar1 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_f8);
      cmLinkItem::cmLinkItem(&local_e0,(cmGeneratorTarget *)sVar1,false,&local_f8);
      pVar5 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                        ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                         &configs,&local_e0);
      local_108 = (_Base_ptr)pVar5.first._M_node;
      local_100 = pVar5.second;
      cmLinkItem::~cmLinkItem(&local_e0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_f8);
      sVar1 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_158);
      cmLinkItem::cmLinkItem(&local_148,(cmGeneratorTarget *)sVar1,true,&local_158);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&configs,
                 &local_148);
      cmLinkItem::~cmLinkItem(&local_148);
      cmListFileBacktrace::~cmListFileBacktrace(&local_158);
      this_01 = cmGeneratorTarget::GetLinkImplementation
                          ((cmGeneratorTarget *)
                           emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,local_a0,Link);
      if (this_01 != (cmLinkImplementation *)0x0) {
        __end3 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                           ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_01);
        lib = (cmLinkImplItem *)
              std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                        ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_01);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                           *)&lib), bVar2) {
          __x = __gnu_cxx::
                __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                ::operator*(&__end3);
          pVar5 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                            ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                             &configs,&__x->super_cmLinkItem);
          if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            AddTargetDepend(this,depender_index,&__x->super_cmLinkItem,true,false);
            AddInterfaceDepends(this,depender_index,&__x->super_cmLinkItem,local_a0,
                                (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                                 *)&configs);
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&__end3);
        }
        this_02 = &(this_01->super_cmLinkImplementationLibraries).Objects;
        __end3_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(this_02);
        obj = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(this_02);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                   *)&obj), bVar2) {
          this_03 = __gnu_cxx::
                    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                    ::operator*(&__end3_1);
          this_00 = *(cmMakefile **)(emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
          sourceName = cmLinkItem::AsStr_abi_cxx11_(this_03);
          objectFiles.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)cmMakefile::GetSource(this_00,sourceName,Known);
          if ((cmSourceFile *)
              objectFiles.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (cmSourceFile *)0x0) {
            AddObjectDepends(this,depender_index,
                             (cmSourceFile *)
                             objectFiles.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                             &configs);
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
          ::operator++(&__end3_1);
        }
      }
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
      cmGeneratorTarget::GetExternalObjects
                ((cmGeneratorTarget *)emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2,
                 local_a0);
      __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &__range2);
      o_1 = (cmSourceFile *)
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                         *)&o_1), bVar2) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&__end2);
        AddObjectDepends(this,depender_index,*ppcVar4,
                         (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                         &configs);
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&__end2);
      }
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)&configs);
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)cmGeneratorTarget::GetUtilityItems
                           ((cmGeneratorTarget *)
                            emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_248);
    sVar1 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_298.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_298.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_298);
    cmLinkItem::cmLinkItem(&local_288,(cmGeneratorTarget *)sVar1,false,&local_298);
    pVar5 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                      ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                       local_248,&local_288);
    local_2a8 = (_Base_ptr)pVar5.first._M_node;
    local_2a0 = pVar5.second;
    cmLinkItem::~cmLinkItem(&local_288);
    cmListFileBacktrace::~cmListFileBacktrace(&local_298);
    sVar1 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_2f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_2f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_2f8);
    cmLinkItem::cmLinkItem(&local_2e8,(cmGeneratorTarget *)sVar1,true,&local_2f8);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_248,
               &local_2e8);
    cmLinkItem::~cmLinkItem(&local_2e8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_2f8);
    sVar1 = emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_1 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                         ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                          emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    litem = (cmLinkItem *)
            std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end
                      ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)sVar1)
    ;
    while (bVar2 = std::operator!=(&__end1_1,(_Self *)&litem), bVar2) {
      __x_00 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&__end1_1);
      pVar5 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                        ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                         local_248,__x_00);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        AddTargetDepend(this,depender_index,__x_00,false,(bool)(__x_00->Cross & 1));
      }
      std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&__end1_1);
    }
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::~set
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)local_248);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (!depender->IsInBuildSystem()) {
    return;
  }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
    std::set<cmLinkItem> emitted;

    std::vector<std::string> const& configs =
      depender->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (std::string const& it : configs) {
      // A target should not depend on itself.
      emitted.insert(cmLinkItem(depender, false, cmListFileBacktrace()));
      emitted.insert(cmLinkItem(depender, true, cmListFileBacktrace()));

      if (cmLinkImplementation const* impl = depender->GetLinkImplementation(
            it, cmGeneratorTarget::LinkInterfaceFor::Link)) {
        for (cmLinkImplItem const& lib : impl->Libraries) {
          // Don't emit the same library twice for this target.
          if (emitted.insert(lib).second) {
            this->AddTargetDepend(depender_index, lib, true, false);
            this->AddInterfaceDepends(depender_index, lib, it, emitted);
          }
        }
        for (cmLinkItem const& obj : impl->Objects) {
          if (cmSourceFile const* o = depender->Makefile->GetSource(
                obj.AsStr(), cmSourceFileLocationKind::Known)) {
            this->AddObjectDepends(depender_index, o, emitted);
          }
        }
      }

      // Add dependencies on object libraries not otherwise handled above.
      std::vector<cmSourceFile const*> objectFiles;
      depender->GetExternalObjects(objectFiles, it);
      for (cmSourceFile const* o : objectFiles) {
        this->AddObjectDepends(depender_index, o, emitted);
      }
    }
  }

  // Loop over all utility dependencies.
  {
    std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
    std::set<cmLinkItem> emitted;
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, false, cmListFileBacktrace()));
    emitted.insert(cmLinkItem(depender, true, cmListFileBacktrace()));
    for (cmLinkItem const& litem : tutils) {
      // Don't emit the same utility twice for this target.
      if (emitted.insert(litem).second) {
        this->AddTargetDepend(depender_index, litem, false, litem.Cross);
      }
    }
  }
}